

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O1

ptr<snapshot> __thiscall calc_server::calc_state_machine::last_snapshot(calc_state_machine *this)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ptr<snapshot> pVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x48));
  if (iVar2 == 0) {
    if ((_Rb_tree_node_base *)(in_RSI + 0x20) == *(_Rb_tree_node_base **)(in_RSI + 0x30)) {
      (this->super_state_machine)._vptr_state_machine = (_func_int **)0x0;
      (this->cur_value_).super___atomic_base<long>._M_i = 0;
    }
    else {
      lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(in_RSI + 0x20));
      puVar1 = *(undefined8 **)(lVar3 + 0x28);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x30);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      (this->super_state_machine)._vptr_state_machine = (_func_int **)*puVar1;
      lVar3 = puVar1[1];
      (this->cur_value_).super___atomic_base<long>._M_i = lVar3;
      if (lVar3 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x48));
    pVar4.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar4.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ptr<snapshot>)pVar4.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ptr<snapshot> last_snapshot() {
        // Just return the latest snapshot.
        std::lock_guard<std::mutex> ll(snapshots_lock_);
        auto entry = snapshots_.rbegin();
        if (entry == snapshots_.rend()) return nullptr;

        ptr<snapshot_ctx> ctx = entry->second;
        return ctx->snapshot_;
    }